

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtThreadSupportPosix.cpp
# Opt level: O1

void __thiscall cbtThreadSupportPosix::stopThreads(cbtThreadSupportPosix *this)

{
  cbtThreadStatus *pcVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if ((this->m_activeThreadStatus).m_size != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      pcVar1 = (this->m_activeThreadStatus).m_data;
      lVar5 = lVar7 >> 0x20;
      pcVar1[lVar5].m_userPtr = (void *)0x0;
      iVar2 = sem_post((sem_t *)pcVar1[lVar5].startSemaphore);
      if (iVar2 != 0) {
        uVar3 = sem_post((sem_t *)pcVar1[lVar5].startSemaphore);
        puVar4 = (uint *)__errno_location();
        printf("PThread problem at line %i in file %s: %i %d\n",0x130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/bullet/LinearMath/TaskScheduler/cbtThreadSupportPosix.cpp"
               ,(ulong)uVar3,(ulong)*puVar4);
      }
      iVar2 = sem_wait((sem_t *)this->m_mainSemaphore);
      if (iVar2 != 0) {
        uVar3 = sem_wait((sem_t *)this->m_mainSemaphore);
        puVar4 = (uint *)__errno_location();
        printf("PThread problem at line %i in file %s: %i %d\n",0x131,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/bullet/LinearMath/TaskScheduler/cbtThreadSupportPosix.cpp"
               ,(ulong)uVar3,(ulong)*puVar4);
      }
      destroySem(pcVar1[lVar5].startSemaphore);
      iVar2 = pthread_join(pcVar1[lVar5].thread,(void **)0x0);
      if (iVar2 != 0) {
        uVar3 = pthread_join(pcVar1[lVar5].thread,(void **)0x0);
        puVar4 = (uint *)__errno_location();
        printf("PThread problem at line %i in file %s: %i %d\n",0x134,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/bullet/LinearMath/TaskScheduler/cbtThreadSupportPosix.cpp"
               ,(ulong)uVar3,(ulong)*puVar4);
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x100000000;
    } while (uVar6 < (ulong)(long)(this->m_activeThreadStatus).m_size);
  }
  destroySem(this->m_mainSemaphore);
  pcVar1 = (this->m_activeThreadStatus).m_data;
  if (pcVar1 != (cbtThreadStatus *)0x0) {
    if ((this->m_activeThreadStatus).m_ownsMemory == true) {
      cbtAlignedFreeInternal(pcVar1);
    }
    (this->m_activeThreadStatus).m_data = (cbtThreadStatus *)0x0;
  }
  (this->m_activeThreadStatus).m_ownsMemory = true;
  (this->m_activeThreadStatus).m_data = (cbtThreadStatus *)0x0;
  (this->m_activeThreadStatus).m_size = 0;
  (this->m_activeThreadStatus).m_capacity = 0;
  return;
}

Assistant:

void cbtThreadSupportPosix::stopThreads()
{
	for (size_t t = 0; t < size_t(m_activeThreadStatus.size()); ++t)
	{
		cbtThreadStatus& threadStatus = m_activeThreadStatus[t];

		threadStatus.m_userPtr = 0;
		checkPThreadFunction(sem_post(threadStatus.startSemaphore));
		checkPThreadFunction(sem_wait(m_mainSemaphore));

		destroySem(threadStatus.startSemaphore);
		checkPThreadFunction(pthread_join(threadStatus.thread, 0));
	}
	destroySem(m_mainSemaphore);
	m_activeThreadStatus.clear();
}